

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_extrude.cpp
# Opt level: O2

int ON_BrepExtrudeFace(ON_Brep *brep,int face_index,ON_Curve *path_curve,bool bCap)

{
  int iVar1;
  TYPE TVar2;
  ON_BrepFace *pOVar3;
  ON_BrepLoop *pOVar4;
  ON_3dVector path_vector_00;
  ON_3dVector path_vector_01;
  bool bVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  size_t sVar12;
  long lVar13;
  size_t newcap;
  uint uVar14;
  byte bVar15;
  long lVar16;
  uint local_b0;
  uint local_ac;
  int local_94;
  long local_90;
  int **local_88;
  ON_SimpleArray<int> side_face_index;
  ON_SimpleArray<int> side_face_index_loop_mark;
  ON_3dVector path_vector;
  
  uVar11 = (ulong)(uint)face_index;
  ON_Brep::DestroyMesh(brep,any_mesh);
  ON_Brep::DestroyRegionTopology(brep);
  if (face_index < 0) {
    return 0;
  }
  if ((brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count <=
      face_index) {
    return 0;
  }
  pOVar3 = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
  lVar16 = uVar11 * 0xd8;
  iVar7 = pOVar3[uVar11].m_li.m_count;
  newcap = (size_t)iVar7;
  if ((long)newcap < 1) {
    return 0;
  }
  if (iVar7 == 1) {
    iVar7 = ON_BrepExtrudeLoop(brep,*pOVar3[uVar11].m_li.m_a,path_curve,bCap);
    return iVar7;
  }
  side_face_index._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081add8;
  side_face_index.m_a = (int *)0x0;
  side_face_index.m_count = 0;
  side_face_index.m_capacity = 0;
  side_face_index_loop_mark._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081add8;
  side_face_index_loop_mark.m_a = (int *)0x0;
  side_face_index_loop_mark.m_count = 0;
  side_face_index_loop_mark.m_capacity = 0;
  bVar5 = ON_BrepExtrudeHelper_CheckPathCurve(path_curve,&path_vector);
  if (bVar5) {
    lVar8 = (long)(brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                  m_count;
    pOVar4 = (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
    iVar7 = 0;
    uVar14 = 0;
    for (sVar12 = 0; newcap != sVar12; sVar12 = sVar12 + 1) {
      iVar1 = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a
              [uVar11].m_li.m_a[sVar12];
      lVar13 = (long)iVar1;
      if ((lVar13 < 0) ||
         ((brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count <=
          iVar1)) goto LAB_00429c6c;
      if (pOVar4[lVar13].m_type - outer < 2) {
        iVar7 = iVar7 + pOVar4[lVar13].m_ti.m_count;
      }
    }
    if (iVar7 != 0) {
      ON_BrepExtrudeHelper_ReserveSpace(brep,iVar7,(uint)bCap);
      ON_SimpleArray<int>::Reserve(&side_face_index,(long)iVar7);
      ON_SimpleArray<int>::Reserve(&side_face_index_loop_mark,newcap);
      local_88 = &(brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a
                  [uVar11].m_li.m_a;
      uVar14 = 1;
      uVar11 = 0;
      local_b0 = 0xffffffff;
      local_ac = local_b0;
      local_90 = lVar16;
      while ((uVar11 < newcap && (uVar14 != 0))) {
        local_94 = side_face_index.m_count;
        ON_SimpleArray<int>::Append(&side_face_index_loop_mark,&local_94);
        uVar14 = (*local_88)[uVar11];
        if (((long)(int)uVar14 < 0) ||
           (TVar2 = (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
                    m_a[(int)uVar14].m_type, 1 < TVar2 - outer)) {
          uVar14 = 1;
        }
        else {
          bVar6 = 0;
          if ((int)local_b0 < 0) {
            bVar6 = bCap;
          }
          bVar15 = TVar2 == outer & bCap;
          if (bVar15 != 0) {
            bCap = (bool)bVar6;
          }
          bVar5 = ON_BrepExtrudeHelper_MakeSides
                            (brep,uVar14,path_curve,(bool)(bCap & 1),&side_face_index);
          uVar10 = local_ac;
          uVar9 = local_b0;
          if ((int)local_b0 < 0) {
            uVar10 = (uint)uVar11;
            uVar9 = uVar14;
          }
          if (bVar15 != 0) {
            local_b0 = uVar9;
            local_ac = uVar10;
          }
          uVar14 = (uint)bVar5;
          lVar16 = local_90;
        }
        uVar11 = uVar11 + 1;
      }
      if (((uVar14 != 0) && ((bCap & 1U) != 0)) && (-1 < (int)local_b0)) {
        iVar7 = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                m_count;
        path_vector_00.y = path_vector.y;
        path_vector_00.x = path_vector.x;
        path_vector_00.z = path_vector.z;
        bVar5 = ON_BrepExtrudeHelper_MakeCap
                          (brep,local_b0,path_vector_00,
                           side_face_index.m_a + side_face_index_loop_mark.m_a[(int)local_ac]);
        uVar14 = 1;
        if ((bVar5) &&
           (iVar1 = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                    m_count, iVar7 < iVar1)) {
          pOVar3 = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                   m_a;
          uVar14 = 2;
          for (sVar12 = 0; lVar16 = local_90, newcap != sVar12; sVar12 = sVar12 + 1) {
            uVar10 = (*local_88)[sVar12];
            if (((uVar10 != local_b0 && -1 < (int)uVar10) &&
                ((brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a
                 [uVar10].m_type - outer < 2)) &&
               (path_vector_01.y = path_vector.y, path_vector_01.x = path_vector.x,
               path_vector_01.z = path_vector.z,
               bVar5 = ON_BrepExtrudeHelper_MakeTopLoop
                                 (brep,pOVar3 + (long)iVar1 + -1,uVar10,path_vector_01,
                                  side_face_index.m_a + side_face_index_loop_mark.m_a[sVar12]),
               bVar5)) {
              pOVar4 = (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                       super_ON_ClassArray<ON_BrepLoop>.m_a;
              pOVar4[(long)(brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                           super_ON_ClassArray<ON_BrepLoop>.m_count + -1].m_type =
                   pOVar4[uVar10].m_type;
            }
          }
        }
      }
      if ((((brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a)->
          m_face_uuid).Data4[lVar16 + -0x10] == '\x01') {
        lVar16 = lVar8 * 0xd8;
        for (; lVar8 < (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.
                       super_ON_ClassArray<ON_BrepFace>.m_count; lVar8 = lVar8 + 1) {
          ON_Brep::FlipFace(brep,(ON_BrepFace *)
                                 ((((brep->m_F).super_ON_ObjectArray<ON_BrepFace>.
                                    super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                                 lVar16 + -0x5c));
          lVar16 = lVar16 + 0xd8;
        }
      }
      goto LAB_00429c6c;
    }
  }
  uVar14 = 0;
LAB_00429c6c:
  ON_SimpleArray<int>::~ON_SimpleArray(&side_face_index_loop_mark);
  ON_SimpleArray<int>::~ON_SimpleArray(&side_face_index);
  return uVar14;
}

Assistant:

int ON_BrepExtrudeFace( 
          ON_Brep& brep,
          int face_index,
          const ON_Curve& path_curve,
          bool bCap
          )
{
  int rc = 0; // returns 1 for success with no cap, 2 for success with a cap

  brep.DestroyMesh(ON::any_mesh);
  brep.DestroyRegionTopology();

  if ( face_index < 0 || face_index >= brep.m_F.Count() )
    return false;

  const int face_loop_count = brep.m_F[face_index].m_li.Count();
  if ( face_loop_count < 1 )
    return false;


  if ( brep.m_F[face_index].m_li.Count() == 1 )
  {
    rc = ON_BrepExtrudeLoop( brep, brep.m_F[face_index].m_li[0], path_curve, bCap );
  }
  else
  {
    ON_3dVector path_vector;
    ON_SimpleArray<int> side_face_index;
    ON_SimpleArray<int> side_face_index_loop_mark;
    int li, fli;

    if ( !ON_BrepExtrudeHelper_CheckPathCurve( path_curve, path_vector ) )
      return 0;

    //const int trim_count0 = brep.m_T.Count();
    const int loop_count0 = brep.m_L.Count();
    const int face_count0 = brep.m_F.Count();

    // count number of new objects so we can grow arrays
    // efficiently and use refs to dynamic array elements.
    int new_side_trim_count = 0;
    for ( fli = 0; fli < face_loop_count; fli++ )
    {
      li = brep.m_F[face_index].m_li[fli];
      if ( li < 0 || li >= loop_count0 )
        return false;
      if ( !ON_BrepExtrudeHelper_CheckLoop( brep, li ) )
        continue;
      new_side_trim_count += brep.m_L[li].m_ti.Count();
    }
    if ( new_side_trim_count == 0 )
      return false;
    ON_BrepExtrudeHelper_ReserveSpace( brep, new_side_trim_count, bCap?1:0 );

    side_face_index.Reserve(new_side_trim_count);
    side_face_index_loop_mark.Reserve(face_loop_count);

    const ON_BrepFace& face = brep.m_F[face_index];
  
    rc = true;
    int outer_loop_index = -1;
    int outer_fli = -1;
    for ( fli = 0; fli < face_loop_count && rc; fli++ )
    {
      side_face_index_loop_mark.Append( side_face_index.Count() );
      li = face.m_li[fli];
      if ( !ON_BrepExtrudeHelper_CheckLoop( brep, li ) )
        continue;
      ON_BrepLoop& loop = brep.m_L[li];
      if ( bCap && loop.m_type == ON_BrepLoop::outer )
      {
        if ( outer_loop_index >= 0 )
          bCap = false;
        else 
        {
          outer_loop_index = li;
          outer_fli = fli;
        }
      }
      rc = ON_BrepExtrudeHelper_MakeSides( brep, li, path_curve, bCap, side_face_index );
    }

    if ( bCap && rc && outer_loop_index >= 0 )
    {
      const int face_count1 = brep.m_F.Count();
      bCap = ON_BrepExtrudeHelper_MakeCap( 
                  brep, 
                  outer_loop_index, 
                  path_vector, 
                  side_face_index.Array() + side_face_index_loop_mark[outer_fli] );
      if ( bCap && brep.m_F.Count() > face_count1)
      {
        // put inner bondaries on the cap
        rc = 2;

        ON_BrepFace& cap_face = brep.m_F[brep.m_F.Count()-1];
        for ( fli = 0; fli < face_loop_count && rc; fli++ )
        {
          li = face.m_li[fli];
          if ( li == outer_loop_index )
            continue;
          if ( !ON_BrepExtrudeHelper_CheckLoop( brep, li ) )
            continue;
          if ( ON_BrepExtrudeHelper_MakeTopLoop( 
                      brep, 
                      cap_face, 
                      li, 
                      path_vector,
                      side_face_index.Array() + side_face_index_loop_mark[fli] ) )
          {
            ON_BrepLoop& top_loop = brep.m_L[brep.m_L.Count()-1];
            top_loop.m_type = brep.m_L[li].m_type;
          }
        }
      }
    }

    if ( brep.m_F[face_index].m_bRev )
    {
      for ( int fi = face_count0; fi < brep.m_F.Count(); fi++ )
      {
        brep.FlipFace(brep.m_F[fi]);
      }
    }
  }

  return rc;
}